

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int partition_cdf_length(BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_local;
  undefined4 local_4;
  
  if (bsize < BLOCK_8X16) {
    local_4 = 4;
  }
  else if (bsize == BLOCK_128X128) {
    local_4 = 8;
  }
  else {
    local_4 = 10;
  }
  return local_4;
}

Assistant:

static inline int partition_cdf_length(BLOCK_SIZE bsize) {
  if (bsize <= BLOCK_8X8)
    return PARTITION_TYPES;
  else if (bsize == BLOCK_128X128)
    return EXT_PARTITION_TYPES - 2;
  else
    return EXT_PARTITION_TYPES;
}